

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O3

bool tcu::isLinearMipmapLinearCompareResultValid
               (ConstPixelBufferAccess *level0,ConstPixelBufferAccess *level1,Sampler *sampler,
               TexComparePrecision *prec,Vec2 *coord,int coordZ,Vec2 *fBounds,float cmpReference,
               float result)

{
  int dim;
  int dim_00;
  int dim_01;
  int dim_02;
  ulong uVar1;
  ConstPixelBufferAccess *pCVar2;
  Vec2 VVar3;
  bool isFixedPointDepth;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint c;
  int c_00;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar20;
  float fVar21;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float local_118 [2];
  float local_108 [2];
  float local_f8 [2];
  Vec2 uBounds1;
  Vec2 uBounds0;
  Vec4 local_d0;
  Vec4 local_c0;
  ulong local_b0;
  ConstPixelBufferAccess *local_a8;
  ulong local_a0;
  ConstPixelBufferAccess *local_98;
  TexComparePrecision *local_90;
  Vec2 local_88;
  Vec2 local_80;
  Vec2 local_78;
  Vec2 local_70;
  Vec2 vBounds1;
  Vec2 vBounds0;
  
  isFixedPointDepth = isFixedPointDepthTextureFormat(&level0->m_format);
  dim = (level0->m_size).m_data[0];
  dim_00 = (level0->m_size).m_data[1];
  dim_01 = (level1->m_size).m_data[0];
  dim_02 = (level1->m_size).m_data[1];
  local_a8 = level0;
  local_98 = level1;
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds0,sampler->normalizedCoords,dim,coord->m_data[0],
             (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds1,sampler->normalizedCoords,dim_01,coord->m_data[0],
             (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds0,sampler->normalizedCoords,dim_00,coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  local_90 = prec;
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds1,sampler->normalizedCoords,dim_02,coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar10 = floorf(uBounds0.m_data[0] + -0.5);
  fVar11 = floorf(uBounds0.m_data[1] + -0.5);
  fVar12 = floorf(uBounds1.m_data[0] + -0.5);
  fVar13 = floorf(uBounds1.m_data[1] + -0.5);
  fVar15 = vBounds0.m_data[1];
  fVar14 = floorf(vBounds0.m_data[0] + -0.5);
  fVar15 = floorf(fVar15 + -0.5);
  uVar16 = (uint)fVar14;
  fVar14 = floorf(vBounds1.m_data[0] + -0.5);
  fVar17 = floorf(vBounds1.m_data[1] + -0.5);
  if ((int)uVar16 <= (int)fVar15) {
    do {
      local_b0 = (ulong)uVar16;
      if ((int)fVar10 <= (int)fVar11) {
        fVar18 = (float)(int)uVar16;
        iVar9 = (int)fVar10;
        do {
          VVar3.m_data = vBounds0.m_data;
          uVar1 = local_b0;
          fVar27 = uBounds0.m_data[1];
          fVar26 = uBounds0.m_data[0];
          iVar5 = TexVerifierUtil::wrap(sampler->wrapS,iVar9,dim);
          c_00 = iVar9 + 1;
          iVar6 = TexVerifierUtil::wrap(sampler->wrapS,c_00,dim);
          iVar7 = TexVerifierUtil::wrap(sampler->wrapT,(int)uVar1,dim_00);
          iVar8 = TexVerifierUtil::wrap(sampler->wrapT,uVar16 + 1,dim_00);
          pCVar2 = local_a8;
          local_c0.m_data[0] = lookupDepth(local_a8,sampler,iVar5,iVar7,coordZ);
          local_c0.m_data[1] = lookupDepth(pCVar2,sampler,iVar6,iVar7,coordZ);
          local_c0.m_data[2] = lookupDepth(pCVar2,sampler,iVar5,iVar8,coordZ);
          local_c0.m_data[3] = lookupDepth(pCVar2,sampler,iVar6,iVar8,coordZ);
          if ((int)fVar14 <= (int)fVar17) {
            fVar19 = (float)iVar9;
            fVar26 = (fVar26 + -0.5) - fVar19;
            fVar29 = (fVar27 + -0.5) - fVar19;
            auVar22._4_4_ = fVar29;
            auVar22._0_4_ = fVar26;
            auVar22._8_4_ = 0.0 - fVar19;
            auVar22._12_4_ = 0.0 - fVar19;
            auVar22 = minps(_DAT_00ad8ca0,auVar22);
            local_118[0] = VVar3.m_data[0];
            local_118[1] = VVar3.m_data[1];
            fVar27 = (local_118[0] + -0.5) - fVar18;
            fVar19 = (local_118[1] + -0.5) - fVar18;
            auVar23._4_4_ = fVar19;
            auVar23._0_4_ = fVar27;
            auVar23._8_4_ = 0.0 - fVar18;
            auVar23._12_4_ = 0.0 - fVar18;
            auVar23 = minps(_DAT_00ad8ca0,auVar23);
            c = (int)fVar14;
            do {
              local_a0 = (ulong)c;
              fVar20 = (float)(int)c;
              c = c + 1;
              iVar9 = (int)fVar12;
              while (iVar9 <= (int)fVar13) {
                fVar21 = (float)iVar9;
                fVar28 = (uBounds1.m_data[0] + -0.5) - fVar21;
                fVar30 = (uBounds1.m_data[1] + -0.5) - fVar21;
                auVar24._4_4_ = fVar30;
                auVar24._0_4_ = fVar28;
                auVar24._8_4_ = 0.0 - fVar21;
                auVar24._12_4_ = 0.0 - fVar21;
                auVar24 = minps(_DAT_00ad8ca0,auVar24);
                fVar21 = (vBounds1.m_data[0] + -0.5) - fVar20;
                fVar31 = (vBounds1.m_data[1] + -0.5) - fVar20;
                auVar25._4_4_ = fVar31;
                auVar25._0_4_ = fVar21;
                auVar25._8_4_ = 0.0 - fVar20;
                auVar25._12_4_ = 0.0 - fVar20;
                auVar25 = minps(_DAT_00ad8ca0,auVar25);
                iVar5 = TexVerifierUtil::wrap(sampler->wrapS,iVar9,dim_01);
                iVar6 = TexVerifierUtil::wrap(sampler->wrapS,iVar9 + 1,dim_01);
                iVar7 = TexVerifierUtil::wrap(sampler->wrapT,(int)local_a0,dim_02);
                iVar8 = TexVerifierUtil::wrap(sampler->wrapT,c,dim_02);
                pCVar2 = local_98;
                local_d0.m_data[0] = lookupDepth(local_98,sampler,iVar5,iVar7,coordZ);
                local_d0.m_data[1] = lookupDepth(pCVar2,sampler,iVar6,iVar7,coordZ);
                local_d0.m_data[2] = lookupDepth(pCVar2,sampler,iVar5,iVar8,coordZ);
                local_d0.m_data[3] = lookupDepth(pCVar2,sampler,iVar6,iVar8,coordZ);
                local_70.m_data[0] = (float)(-(uint)(0.0 <= fVar26) & auVar22._0_4_);
                local_70.m_data[1] = (float)(-(uint)(0.0 <= fVar29) & auVar22._4_4_);
                local_78.m_data[0] = (float)(-(uint)(0.0 <= fVar27) & auVar23._0_4_);
                local_78.m_data[1] = (float)(-(uint)(0.0 <= fVar19) & auVar23._4_4_);
                local_80.m_data[1] = (float)(-(uint)(0.0 <= fVar30) & auVar24._4_4_);
                local_80.m_data[0] = (float)(-(uint)(0.0 <= fVar28) & auVar24._0_4_);
                local_88.m_data[0] = (float)(-(uint)(0.0 <= fVar21) & auVar25._0_4_);
                local_88.m_data[1] = (float)(-(uint)(0.0 <= fVar31) & auVar25._4_4_);
                bVar4 = isTrilinearCompareValid
                                  (sampler->compare,local_90,&local_c0,&local_d0,&local_70,&local_78
                                   ,&local_80,&local_88,fBounds,cmpReference,result,
                                   isFixedPointDepth);
                iVar9 = iVar9 + 1;
                if (bVar4) {
                  return true;
                }
              }
            } while ((int)c <= (int)fVar17);
          }
          iVar9 = c_00;
        } while (c_00 <= (int)fVar11);
      }
      uVar16 = uVar16 + 1;
    } while ((int)uVar16 <= (int)fVar15);
  }
  return false;
}

Assistant:

static bool isLinearMipmapLinearCompareResultValid (const ConstPixelBufferAccess&	level0,
													const ConstPixelBufferAccess&	level1,
													const Sampler&					sampler,
													const TexComparePrecision&		prec,
													const Vec2&						coord,
													const int						coordZ,
													const Vec2&						fBounds,
													const float						cmpReference,
													const float						result)
{
	const bool	isFixedPointDepth	= isFixedPointDepthTextureFormat(level0.getFormat());

	// \todo [2013-07-04 pyry] This is strictly not correct as coordinates between levels should be dependent.
	//						   Right now this allows pairing any two valid bilinear quads.

	const int	w0					= level0.getWidth();
	const int	w1					= level1.getWidth();
	const int	h0					= level0.getHeight();
	const int	h1					= level1.getHeight();

	const Vec2	uBounds0			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w0,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	uBounds1			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w1,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds0			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h0,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());
	const Vec2	vBounds1			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h1,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int	minI0				= deFloorFloatToInt32(uBounds0.x()-0.5f);
	const int	maxI0				= deFloorFloatToInt32(uBounds0.y()-0.5f);
	const int	minI1				= deFloorFloatToInt32(uBounds1.x()-0.5f);
	const int	maxI1				= deFloorFloatToInt32(uBounds1.y()-0.5f);
	const int	minJ0				= deFloorFloatToInt32(vBounds0.x()-0.5f);
	const int	maxJ0				= deFloorFloatToInt32(vBounds0.y()-0.5f);
	const int	minJ1				= deFloorFloatToInt32(vBounds1.x()-0.5f);
	const int	maxJ1				= deFloorFloatToInt32(vBounds1.y()-0.5f);

	for (int j0 = minJ0; j0 <= maxJ0; j0++)
	{
		for (int i0 = minI0; i0 <= maxI0; i0++)
		{
			const float	minA0	= de::clamp((uBounds0.x()-0.5f)-float(i0), 0.0f, 1.0f);
			const float	maxA0	= de::clamp((uBounds0.y()-0.5f)-float(i0), 0.0f, 1.0f);
			const float	minB0	= de::clamp((vBounds0.x()-0.5f)-float(j0), 0.0f, 1.0f);
			const float	maxB0	= de::clamp((vBounds0.y()-0.5f)-float(j0), 0.0f, 1.0f);
			Vec4		depths0;

			{
				const int	x0		= wrap(sampler.wrapS, i0  , w0);
				const int	x1		= wrap(sampler.wrapS, i0+1, w0);
				const int	y0		= wrap(sampler.wrapT, j0  , h0);
				const int	y1		= wrap(sampler.wrapT, j0+1, h0);

				depths0[0] = lookupDepth(level0, sampler, x0, y0, coordZ);
				depths0[1] = lookupDepth(level0, sampler, x1, y0, coordZ);
				depths0[2] = lookupDepth(level0, sampler, x0, y1, coordZ);
				depths0[3] = lookupDepth(level0, sampler, x1, y1, coordZ);
			}

			for (int j1 = minJ1; j1 <= maxJ1; j1++)
			{
				for (int i1 = minI1; i1 <= maxI1; i1++)
				{
					const float	minA1	= de::clamp((uBounds1.x()-0.5f)-float(i1), 0.0f, 1.0f);
					const float	maxA1	= de::clamp((uBounds1.y()-0.5f)-float(i1), 0.0f, 1.0f);
					const float	minB1	= de::clamp((vBounds1.x()-0.5f)-float(j1), 0.0f, 1.0f);
					const float	maxB1	= de::clamp((vBounds1.y()-0.5f)-float(j1), 0.0f, 1.0f);
					Vec4		depths1;

					{
						const int	x0		= wrap(sampler.wrapS, i1  , w1);
						const int	x1		= wrap(sampler.wrapS, i1+1, w1);
						const int	y0		= wrap(sampler.wrapT, j1  , h1);
						const int	y1		= wrap(sampler.wrapT, j1+1, h1);

						depths1[0] = lookupDepth(level1, sampler, x0, y0, coordZ);
						depths1[1] = lookupDepth(level1, sampler, x1, y0, coordZ);
						depths1[2] = lookupDepth(level1, sampler, x0, y1, coordZ);
						depths1[3] = lookupDepth(level1, sampler, x1, y1, coordZ);
					}

					if (isTrilinearCompareValid(sampler.compare, prec, depths0, depths1,
												Vec2(minA0, maxA0), Vec2(minB0, maxB0),
												Vec2(minA1, maxA1), Vec2(minB1, maxB1),
												fBounds, cmpReference, result, isFixedPointDepth))
						return true;
				}
			}
		}
	}

	return false;
}